

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QSpanCollection::updateInsertedColumns(QSpanCollection *this,int start,int end)

{
  bool bVar1;
  reference ppSVar2;
  list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *this_00;
  int *piVar3;
  int iVar4;
  int in_EDX;
  int in_ESI;
  list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *in_RDI;
  long in_FS_OFFSET;
  int x;
  SubIndex *subindex;
  Span *span;
  SpanList *__range1;
  int delta;
  iterator it;
  iterator it_y;
  iterator __end1;
  iterator __begin1;
  list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *in_stack_ffffffffffffff58
  ;
  list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *in_stack_ffffffffffffff60
  ;
  iterator in_stack_ffffffffffffff70;
  const_iterator in_stack_ffffffffffffff88;
  _Self local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
          empty(in_RDI);
  if (!bVar1) {
    iVar4 = (in_EDX - in_ESI) + 1;
    local_10._M_node = (_List_node_base *)&DAT_aaaaaaaaaaaaaaaa;
    local_10._M_node =
         (_List_node_base *)
         std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
         begin(in_stack_ffffffffffffff60);
    local_18._M_node = (_List_node_base *)&DAT_aaaaaaaaaaaaaaaa;
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::end
                   (in_stack_ffffffffffffff60);
    while (bVar1 = std::operator!=(&local_10,&local_18), bVar1) {
      ppSVar2 = std::_List_iterator<QSpanCollection::Span_*>::operator*
                          ((_List_iterator<QSpanCollection::Span_*> *)0x8b0e15);
      in_stack_ffffffffffffff88._M_node = (_Base_ptr)*ppSVar2;
      if (in_ESI <= *(int *)((long)&(in_stack_ffffffffffffff88._M_node)->_M_parent + 4)) {
        if (in_ESI <= *(int *)&(in_stack_ffffffffffffff88._M_node)->field_0x4) {
          *(int *)&(in_stack_ffffffffffffff88._M_node)->field_0x4 =
               iVar4 + *(int *)&(in_stack_ffffffffffffff88._M_node)->field_0x4;
        }
        *(int *)((long)&(in_stack_ffffffffffffff88._M_node)->_M_parent + 4) =
             iVar4 + *(int *)((long)&(in_stack_ffffffffffffff88._M_node)->_M_parent + 4);
      }
      std::_List_iterator<QSpanCollection::Span_*>::operator++(&local_10);
    }
    QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::begin
              ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)in_stack_ffffffffffffff70._M_node);
    while( true ) {
      QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::end
                ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)in_stack_ffffffffffffff70._M_node
                );
      bVar1 = ::operator!=((iterator *)in_stack_ffffffffffffff60,
                           (iterator *)in_stack_ffffffffffffff58);
      if (!bVar1) break;
      this_00 = (list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)
                QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::value
                          ((iterator *)0x8b0edd);
      QMap<int,_QSpanCollection::Span_*>::begin
                ((QMap<int,_QSpanCollection::Span_*> *)in_stack_ffffffffffffff70._M_node);
      while( true ) {
        QMap<int,_QSpanCollection::Span_*>::end
                  ((QMap<int,_QSpanCollection::Span_*> *)in_stack_ffffffffffffff70._M_node);
        bVar1 = ::operator!=((iterator *)in_stack_ffffffffffffff60,
                             (iterator *)in_stack_ffffffffffffff58);
        if (!bVar1) break;
        piVar3 = QMap<int,_QSpanCollection::Span_*>::iterator::key((iterator *)0x8b0f2e);
        if (-*piVar3 < in_ESI) {
          QMap<int,_QSpanCollection::Span_*>::iterator::operator++
                    ((iterator *)in_stack_ffffffffffffff60);
        }
        else {
          in_stack_ffffffffffffff58 = this_00;
          QMap<int,_QSpanCollection::Span_*>::iterator::value((iterator *)0x8b0f70);
          in_stack_ffffffffffffff70._M_node =
               (_Base_ptr)
               QMap<int,_QSpanCollection::Span_*>::insert
                         (in_stack_ffffffffffffff70._M_node,(int *)in_RDI,
                          (Span **)in_stack_ffffffffffffff60);
          in_stack_ffffffffffffff60 = this_00;
          QMap<int,_QSpanCollection::Span_*>::const_iterator::const_iterator
                    ((const_iterator *)this_00,(iterator *)in_stack_ffffffffffffff58);
          QMap<int,_QSpanCollection::Span_*>::erase
                    ((QMap<int,_QSpanCollection::Span_*> *)in_RDI,
                     (const_iterator)in_stack_ffffffffffffff88._M_node);
        }
      }
      QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::operator++
                ((iterator *)in_stack_ffffffffffffff60);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSpanCollection::updateInsertedColumns(int start, int end)
{
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << start << end << Qt::endl << index;
#endif
    if (spans.empty())
        return;

    int delta = end - start + 1;
#ifdef DEBUG_SPAN_UPDATE
    qDebug("Before");
#endif
    for (Span *span : spans) {
#ifdef DEBUG_SPAN_UPDATE
        qDebug() << span << *span;
#endif
        if (span->m_right < start)
            continue;
        if (span->m_left >= start)
            span->m_left += delta;
        span->m_right += delta;
    }

#ifdef DEBUG_SPAN_UPDATE
    qDebug("After");
    qDebug() << spans;
#endif

    for (Index::iterator it_y = index.begin(); it_y != index.end(); ++it_y) {
        SubIndex &subindex = it_y.value();
        for (SubIndex::iterator it = subindex.begin(); it != subindex.end(); ) {
            int x = -it.key();
            if (x < start) {
                ++it;
                continue;
            }
            subindex.insert(-x - delta, it.value());
            it = subindex.erase(it);
        }
    }
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << index;
#endif
}